

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

nullres nullcCompileWithModuleRoot(char *code,char *moduleRoot)

{
  bool bVar1;
  int iVar2;
  CompilerContext *this;
  ArrayView<InplaceStr> activeImports;
  undefined1 local_50 [12];
  undefined1 local_40 [8];
  TraceScope traceScope;
  char *moduleRoot_local;
  char *code_local;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    code_local._7_1_ = '\0';
  }
  else {
    NULLC::TraceDump();
    if (nullcCompileWithModuleRoot(char_const*,char_const*)::token == '\0') {
      iVar2 = __cxa_guard_acquire(&nullcCompileWithModuleRoot(char_const*,char_const*)::token);
      if (iVar2 != 0) {
        nullcCompileWithModuleRoot::token = NULLC::TraceGetToken("nullc","nullcCompile");
        __cxa_guard_release(&nullcCompileWithModuleRoot(char_const*,char_const*)::token);
      }
    }
    NULLC::TraceScope::TraceScope((TraceScope *)local_40,nullcCompileWithModuleRoot::token);
    NULLC::nullcLastError = "";
    NULLC::destruct<CompilerContext>(NULLC::compilerCtx);
    GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Clear
              ((GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *)NULLC::allocator);
    this = (CompilerContext *)(*(code *)NULLC::alloc)(0xa850);
    iVar2 = NULLC::optimizationLevel;
    ArrayView<InplaceStr>::ArrayView((ArrayView<InplaceStr> *)local_50);
    activeImports._12_4_ = 0;
    activeImports.data = (InplaceStr *)local_50._0_8_;
    activeImports.count = local_50._8_4_;
    CompilerContext::CompilerContext(this,(Allocator *)NULLC::allocator,iVar2,activeImports);
    NULLC::compilerCtx = this;
    *NULLC::errorBuf = '\0';
    NULLC::compilerCtx->errorBuf = NULLC::errorBuf;
    NULLC::compilerCtx->errorBufSize = 0x10000;
    NULLC::compilerCtx->enableLogFiles = (bool)(NULLC::enableLogFiles & 1);
    NULLC::compilerCtx->exprMemoryLimit = NULLC::moduleAnalyzeMemoryLimit;
    (NULLC::compilerCtx->outputCtx).openStream = (_func_void_ptr_char_ptr *)NULLC::openStream;
    (NULLC::compilerCtx->outputCtx).writeStream =
         (_func_void_void_ptr_char_ptr_uint *)NULLC::writeStream;
    (NULLC::compilerCtx->outputCtx).closeStream = (_func_void_void_ptr *)NULLC::closeStream;
    (NULLC::compilerCtx->outputCtx).outputBuf = NULLC::outputBuf;
    (NULLC::compilerCtx->outputCtx).outputBufSize = 0x2000;
    (NULLC::compilerCtx->outputCtx).tempBuf = NULLC::tempOutputBuf;
    (NULLC::compilerCtx->outputCtx).tempBufSize = 0x4000;
    NULLC::compilerCtx->code = code;
    NULLC::compilerCtx->moduleRoot = moduleRoot;
    bVar1 = CompileModuleFromSource(NULLC::compilerCtx);
    if (bVar1) {
      code_local._7_1_ = '\x01';
    }
    else {
      if (NULLC::compilerCtx->errorPos == (char *)0x0) {
        NULLC::nullcLastError = "ERROR: internal error";
      }
      else {
        NULLC::nullcLastError = NULLC::compilerCtx->errorBuf;
      }
      code_local._7_1_ = '\0';
    }
    NULLC::TraceScope::~TraceScope((TraceScope *)local_40);
  }
  return code_local._7_1_;
}

Assistant:

nullres	nullcCompileWithModuleRoot(const char* code, const char *moduleRoot)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	NULLC::TraceDump();

	TRACE_SCOPE("nullc", "nullcCompile");

	nullcLastError = "";

	NULLC::destruct(compilerCtx);

	allocator.Clear();

	compilerCtx = new(NULLC::alloc(sizeof(CompilerContext))) CompilerContext(&allocator, optimizationLevel, ArrayView<InplaceStr>());

	*errorBuf = 0;

	compilerCtx->errorBuf = errorBuf;
	compilerCtx->errorBufSize = NULLC_ERROR_BUFFER_SIZE;

	compilerCtx->enableLogFiles = enableLogFiles;

	compilerCtx->exprMemoryLimit = moduleAnalyzeMemoryLimit;

	compilerCtx->outputCtx.openStream = openStream;
	compilerCtx->outputCtx.writeStream = writeStream;
	compilerCtx->outputCtx.closeStream = closeStream;

	compilerCtx->outputCtx.outputBuf = outputBuf;
	compilerCtx->outputCtx.outputBufSize = NULLC_OUTPUT_BUFFER_SIZE;

	compilerCtx->outputCtx.tempBuf = tempOutputBuf;
	compilerCtx->outputCtx.tempBufSize = NULLC_TEMP_OUTPUT_BUFFER_SIZE;

	compilerCtx->code = code;
	compilerCtx->moduleRoot = moduleRoot;

	if(!CompileModuleFromSource(*compilerCtx))
	{
		if(compilerCtx->errorPos)
			nullcLastError = compilerCtx->errorBuf;
		else
			nullcLastError = "ERROR: internal error";

		return 0;
	}

	return 1;
}